

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PPointer::SetOps(PPointer *this)

{
  bool bVar1;
  byte bVar2;
  
  (this->super_PBasicType).super_PType.storeOp = '1';
  if (this->PointedType == (PType *)0x0) {
    bVar2 = 0x1e;
  }
  else {
    bVar1 = DObject::IsKindOf((DObject *)this->PointedType,PClass::RegistrationInfo.MyClass);
    bVar2 = !bVar1 * '\x02' | 0x1c;
  }
  (this->super_PBasicType).super_PType.loadOp = bVar2;
  (this->super_PBasicType).super_PType.moveOp = ';';
  (this->super_PBasicType).super_PType.RegType = '\x03';
  return;
}

Assistant:

void PPointer::SetOps()
{
	storeOp = OP_SP;
	loadOp = (PointedType && PointedType->IsKindOf(RUNTIME_CLASS(PClass))) ? OP_LO : OP_LP;
	moveOp = OP_MOVEA;
	RegType = REGT_POINTER;
}